

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::UpdateBean::
act<hiberlite::AVisitor<hiberlite::UpdateBean>,std::pair<int,std::vector<int,std::allocator<int>>>,hiberlite::stl_map_adapter<int,std::vector<int,std::allocator<int>>>>
          (UpdateBean *this,AVisitor<hiberlite::UpdateBean> *av,
          collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
          *nvp)

{
  AVisitor<hiberlite::UpdateBean> *pAVar1;
  UpdateBean *this_00;
  WType *_value;
  sqlid_t rowid;
  RowScope *pRVar2;
  long index;
  string tab;
  sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> el_nvp;
  allocator local_1c2;
  allocator local_1c1;
  AVisitor<hiberlite::UpdateBean> *local_1c0;
  collection_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_hiberlite::stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>_>
  *local_1b8;
  UpdateBean *local_1b0;
  stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_> *local_1a8;
  shared_res<hiberlite::autoclosed_con> local_1a0;
  shared_connection local_190;
  string local_180 [32];
  string local_160;
  string local_140;
  string local_120;
  Scope local_100;
  string local_b8;
  string local_98;
  sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> local_78;
  
  local_1b8 = nvp;
  std::__cxx11::string::string((string *)&local_120,(string *)nvp);
  AVisitor<hiberlite::UpdateBean>::diveTable(av,&local_120);
  local_1b0 = this;
  std::__cxx11::string::~string((string *)&local_120);
  local_1c0 = av;
  Scope::Scope(&local_100,&av->scope);
  std::__cxx11::string::string(local_180,(string *)&local_100);
  local_1a8 = &local_1b8->stream;
  Scope::~Scope(&local_100);
  index = 0;
  while ((_Rb_tree_header *)(local_1b8->stream).it._M_node !=
         &(((local_1b8->stream).ct)->_M_t)._M_impl.super__Rb_tree_header) {
    _value = stl_map_adapter<int,_std::vector<int,_std::allocator<int>_>_>::getNext(local_1a8);
    local_190._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_190.res = (local_1c0->rootKey).con.res;
    if (local_190.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_190.res)->refCount = (local_190.res)->refCount + 1;
    }
    std::__cxx11::string::string((string *)&local_98,local_180);
    rowid = Database::allocId(&local_190,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_190);
    std::__cxx11::string::string((string *)&local_140,local_180);
    this_00 = local_1b0;
    pRVar2 = curRow(local_1b0);
    startRow(this_00,&local_140,rowid,pRVar2->id,index);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::string((string *)&local_160,"item",&local_1c1);
    std::__cxx11::string::string((string *)&local_b8,"",&local_1c2);
    sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>::sql_nvp
              ((sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> *)&local_100,
               &local_160,_value,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_160);
    sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>::sql_nvp
              (&local_78,
               (sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> *)&local_100);
    pAVar1 = local_1c0;
    AVisitor<hiberlite::UpdateBean>::operator&(local_1c0,&local_78);
    sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>::~sql_nvp(&local_78);
    local_1a0._vptr_shared_res = (_func_int **)&PTR__shared_res_001bb598;
    local_1a0.res = (pAVar1->rootKey).con.res;
    if (local_1a0.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_1a0.res)->refCount = (local_1a0.res)->refCount + 1;
    }
    commitRow(local_1b0,&local_1a0,rowid);
    shared_res<hiberlite::autoclosed_con>::~shared_res(&local_1a0);
    index = index + 1;
    sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>::~sql_nvp
              ((sql_nvp<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_> *)&local_100);
  }
  AVisitor<hiberlite::UpdateBean>::popScope(local_1c0);
  std::__cxx11::string::~string(local_180);
  return;
}

Assistant:

void UpdateBean::act(AV& av, collection_nvp<E,S> nvp ){

	sqlid_t index=0;
	S& stream=nvp.stream;

	av.diveTable(nvp.name);
		std::string tab=av.getScope().table();
		while(!stream.done()){
			E& el=stream.getNext();
				sqlid_t entry_id=Database::allocId(av.getConnection(), tab);

				startRow(tab,entry_id, curRow()->id,index);
					sql_nvp<E> el_nvp("item",el);
					av & el_nvp;
				commitRow(av.getConnection(), entry_id);
			index++;
		}
	av.pop();
}